

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall GraphPropagator::fullExpl(GraphPropagator *this,vec<Lit> *ps)

{
  uint uVar1;
  BoolView *pBVar2;
  undefined8 in_RAX;
  long lVar3;
  long lVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (0 < (int)(this->vs).sz) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pBVar2 = (this->vs).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3);
        local_38 = CONCAT44((uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2,
                            local_38._0_4_);
        vec<Lit>::push(ps,(Lit *)((long)&local_38 + 4));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < (int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pBVar2 = (this->es).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3);
        local_38 = CONCAT44(local_38._4_4_,
                            (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2);
        vec<Lit>::push(ps,(Lit *)&local_38);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < (int)(this->es).sz);
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(vec<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push(getEdgeVar(i).getValLit());
		}
	}
}